

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::testCaseEnded(JunitReporter *this,TestCaseStats *testCaseStats)

{
  TestCaseStats *testCaseStats_local;
  JunitReporter *this_local;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->stdOutForSuite,&testCaseStats->stdOut);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (&this->stdErrForSuite,&testCaseStats->stdErr);
  CumulativeReporterBase::testCaseEnded(&this->super_CumulativeReporterBase,testCaseStats);
  return;
}

Assistant:

void JunitReporter::testCaseEnded(TestCaseStats const &testCaseStats) {
        stdOutForSuite += testCaseStats.stdOut;
        stdErrForSuite += testCaseStats.stdErr;
        CumulativeReporterBase::testCaseEnded(testCaseStats);
    }